

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateStubMethods
          (ServiceGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RDI;
  Formatter format;
  MethodDescriptor *method;
  int i;
  Options *in_stack_00000088;
  MethodDescriptor *in_stack_00000090;
  Printer *in_stack_ffffffffffffff78;
  Formatter local_58;
  MethodDescriptor *local_20;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    iVar2 = ServiceDescriptor::method_count((ServiceDescriptor *)*in_RDI);
    if (iVar2 <= iVar1) break;
    local_20 = ServiceDescriptor::method((ServiceDescriptor *)*in_RDI,local_14);
    Formatter::Formatter
              (&local_58,in_stack_ffffffffffffff78,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x521dff);
    anon_unknown_3::InitMethodVariables(in_stack_00000090,in_stack_00000088,(Formatter *)this);
    Formatter::operator()
              ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
               (char *)format.vars_._M_t._M_impl._0_8_,(int *)format.printer_);
    Formatter::~Formatter((Formatter *)0x521e3b);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateStubMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format(
        "void $classname$_Stub::$name$(::$proto_ns$::RpcController* "
        "controller,\n"
        "                              const $input_type$* request,\n"
        "                              $output_type$* response,\n"
        "                              ::google::protobuf::Closure* done) {\n"
        "  channel_->CallMethod(descriptor()->method($1$),\n"
        "                       controller, request, response, done);\n"
        "}\n",
        i);
  }
}